

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

bool __thiscall ELFIO::elfio::layout_segments_and_their_sections(elfio *this)

{
  elfio *peVar1;
  segment *seg;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  short sVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined4 extraout_var;
  ulong uVar11;
  ulong uVar12;
  pointer ppsVar13;
  pointer ppsVar14;
  bool bVar15;
  Elf_Xword seg_start_pos;
  Elf_Xword segment_filesize;
  Elf_Xword segment_memory;
  vector<bool,_std::allocator<bool>_> section_generated;
  iterator __end2;
  Elf_Xword local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> local_78;
  vector<bool,_std::allocator<bool>_> local_60;
  pointer local_38;
  
  peVar1 = (this->sections).parent;
  local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.
                        super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_60,
             (ulong)((uint)(*(int *)&(peVar1->sections_).
                                     super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(peVar1->sections_).
                                    super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff),
             (bool *)&local_78,(allocator_type *)&local_88);
  get_ordered_segments(&local_78,this);
  bVar15 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
           super__Vector_impl_data._M_start ==
           local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_80 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_90 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppsVar14 = local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  while (!bVar15) {
    seg = *ppsVar14;
    local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88 = (pointer)0x0;
    local_98 = this->current_file_pos;
    iVar7 = (**(code **)(*(long *)seg + 0x18))(seg);
    if ((iVar7 == 6) && (sVar5 = (**(code **)(*(long *)seg + 0xb0))(seg), sVar5 == 0)) {
      iVar7 = (*((this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
                [0x1e])();
      local_98 = CONCAT44(extraout_var,iVar7);
      uVar8 = (*((this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
                [9])();
      uVar9 = (*((this->header)._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
                [0x1c])();
      local_88 = (pointer)((ulong)(uVar9 & 0xffff) * (ulong)(uVar8 & 0xffff));
      local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
      super__Vector_impl_data._M_start = local_88;
    }
    else {
      cVar3 = (**(code **)(*(long *)seg + 0xc0))(seg);
      if ((cVar3 == '\0') || (lVar10 = (**(code **)(*(long *)seg + 0x88))(seg), lVar10 != 0)) {
        sVar5 = (**(code **)(*(long *)seg + 0xb0))(seg);
        if ((sVar5 == 0) ||
           (uVar6 = (**(code **)(*(long *)seg + 0xb8))(seg,0),
           (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) != 0))
        {
          sVar5 = (**(code **)(*(long *)seg + 0xb0))(seg);
          if (sVar5 != 0) {
            uVar6 = (**(code **)(*(long *)seg + 0xb8))(seg,0);
            local_98 = (**(code **)(*(long *)(((this->sections).parent)->sections_).
                                             super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                                             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                   + 0xb8))();
          }
        }
        else {
          lVar10 = (**(code **)(*(long *)seg + 0x38))(seg);
          if (lVar10 == 0) {
            uVar11 = 1;
          }
          else {
            uVar11 = (**(code **)(*(long *)seg + 0x38))(seg);
          }
          uVar2 = this->current_file_pos;
          uVar12 = (**(code **)(*(long *)seg + 0x48))(seg);
          lVar10 = (**(code **)(*(long *)seg + 0x38))(seg);
          local_98 = ((uVar12 % uVar11 + lVar10) - uVar2 % uVar11) % uVar11 + this->current_file_pos
          ;
          this->current_file_pos = local_98;
        }
      }
      else {
        local_98 = 0;
        sVar5 = (**(code **)(*(long *)seg + 0xb0))(seg);
        if (sVar5 != 0) {
          local_88 = (pointer)this->current_file_pos;
          local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
          super__Vector_impl_data._M_start = local_88;
        }
      }
    }
    bVar4 = write_segment_data(this,seg,&local_60,(Elf_Xword *)&local_78,(Elf_Xword *)&local_88,
                               &local_98);
    if (!bVar4) break;
    (**(code **)(*(long *)seg + 0x70))(seg,&local_88);
    ppsVar13 = (pointer)(**(code **)(*(long *)seg + 0x78))(seg);
    if (ppsVar13 <
        local_78.super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (**(code **)(*(long *)seg + 0x80))(seg,&local_78);
    }
    (**(code **)(*(long *)seg + 200))(seg);
    if (!bVar4) break;
    ppsVar14 = ppsVar14 + 1;
    bVar15 = ppsVar14 == local_38;
  }
  if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_90 != (pointer)0x0) {
    operator_delete(local_90,(long)local_80 - (long)local_90);
  }
  return bVar15;
}

Assistant:

bool layout_segments_and_their_sections()
    {
        std::vector<segment*> worklist;
        std::vector<bool>     section_generated( sections.size(), false );

        // Get segments in a order in where segments which contain a
        // sub sequence of other segments are located at the end
        worklist = get_ordered_segments();

        for ( auto* seg : worklist ) {
            Elf_Xword segment_memory   = 0;
            Elf_Xword segment_filesize = 0;
            Elf_Xword seg_start_pos    = current_file_pos;
            // Special case: PHDR segment
            // This segment contains the program headers but no sections
            if ( seg->get_type() == PT_PHDR && seg->get_sections_num() == 0 ) {
                seg_start_pos  = header->get_segments_offset();
                segment_memory = segment_filesize =
                    header->get_segment_entry_size() *
                    static_cast<Elf_Xword>( header->get_segments_num() );
            }
            // Special case:
            else if ( seg->is_offset_initialized() && seg->get_offset() == 0 ) {
                seg_start_pos = 0;
                if ( seg->get_sections_num() > 0 ) {
                    segment_memory = segment_filesize = current_file_pos;
                }
            }
            // New segments with not generated sections
            // have to be aligned
            else if ( seg->get_sections_num() > 0 &&
                      !section_generated[seg->get_section_index_at( 0 )] ) {
                Elf_Xword align = seg->get_align() > 0 ? seg->get_align() : 1;
                Elf64_Off cur_page_alignment = current_file_pos % align;
                Elf64_Off req_page_alignment =
                    seg->get_virtual_address() % align;
                Elf64_Off adjustment = req_page_alignment - cur_page_alignment;

                current_file_pos += ( seg->get_align() + adjustment ) % align;
                seg_start_pos = current_file_pos;
            }
            else if ( seg->get_sections_num() > 0 ) {
                seg_start_pos =
                    sections[seg->get_section_index_at( 0 )]->get_offset();
            }

            // Write segment's data
            if ( !write_segment_data( seg, section_generated, segment_memory,
                                      segment_filesize, seg_start_pos ) ) {
                return false;
            }

            seg->set_file_size( segment_filesize );

            // If we already have a memory size from loading an elf file (value > 0),
            // it must not shrink!
            // Memory size may be bigger than file size and it is the loader's job to do something
            // with the surplus bytes in memory, like initializing them with a defined value.
            if ( seg->get_memory_size() < segment_memory ) {
                seg->set_memory_size( segment_memory );
            }

            seg->set_offset( seg_start_pos );
        }

        return true;
    }